

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O1

void Lpk_TryDecTest(void)

{
  word Truth [4];
  word local_28 [5];
  
  local_28[0] = 0x4f1ead396f247a04;
  local_28[1] = 0x10bdb210c006eab5;
  local_28[2] = 0x68ab4bfa8acb7a13;
  local_28[3] = 0xb14ede67096c6eed;
  Lpk_TryDec(local_28,8);
  return;
}

Assistant:

void Lpk_TryDecTest()
{
    word t0 = ABC_CONST(0x4f1ead396f247a04);
    word t1 = ABC_CONST(0x10bdb210c006eab5);
    word t2 = ABC_CONST(0x68ab4bfa8acb7a13);
    word t3 = ABC_CONST(0xb14ede67096c6eed);
    word Truth[4] = {t0, t1, t2, t3};
    Lpk_TryDec( Truth, 8 );

}